

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O0

void cfd::TransactionContextUtil::AddScriptHashSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signatures,
               Script *redeem_script,AddressType address_type,bool is_multisig_script)

{
  bool bVar1;
  SignDataType SVar2;
  ulong uVar3;
  undefined8 uVar4;
  CfdException *this;
  undefined8 in_RDX;
  CfdError in_R8D;
  byte in_R9B;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000040;
  OutPoint *in_stack_00000048;
  ConfidentialTransactionContext *in_stack_00000050;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  bool clear_stack;
  SignParameter *signature_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  Script locking_script;
  bool has_scriptsig;
  bool has_witness;
  SignParameter *signature;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2;
  value_type *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  byte in_stack_fffffffffffffb97;
  value_type *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffba0;
  allocator *message;
  undefined4 in_stack_fffffffffffffba8;
  CfdError in_stack_fffffffffffffbac;
  CfdError CVar5;
  SignParameter *in_stack_fffffffffffffbb0;
  ScriptOperator *in_stack_fffffffffffffc08;
  SignParameter *in_stack_fffffffffffffc10;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_300;
  undefined8 local_2f8;
  ByteData local_278 [6];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  char *local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  Script local_1a8;
  Script local_158;
  byte local_11c;
  byte local_11b;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [36];
  SignDataType local_f4;
  char *local_f0;
  undefined4 local_e8;
  char *local_e0;
  SignParameter *local_d8;
  SignParameter *local_d0;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_c8;
  undefined8 local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  char *local_90;
  undefined4 local_88;
  char *local_80;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  char *local_40;
  undefined4 local_38;
  char *local_30;
  byte local_25;
  CfdError local_24;
  undefined8 local_18;
  
  local_25 = in_R9B & 1;
  local_24 = in_R8D;
  local_18 = in_RDX;
  uVar3 = cfd::core::Script::IsEmpty();
  if ((uVar3 & 1) != 0) {
    local_40 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_40 = local_40 + 1;
    local_38 = 0xa7;
    local_30 = "AddScriptHashSign";
    core::logger::warn<>
              ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (char *)in_stack_fffffffffffffb88);
    local_75 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Empty script.",&local_61);
    core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
               in_stack_fffffffffffffba0);
    local_75 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = cfd::core::OutPoint::IsValid();
  if ((uVar3 & 1) != 0) {
    local_c0 = local_18;
    local_c8._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                    in_stack_fffffffffffffb88);
    local_d0 = (SignParameter *)
               std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                         ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                          in_stack_fffffffffffffb88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                         (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffb88);
      if (!bVar1) {
        local_11b = 0;
        local_11c = 0;
        cfd::core::Script::Script(&local_158);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x3a60aa);
        CVar5 = local_24;
        if (local_24 == kCfdIllegalArgumentError) {
          local_11c = 1;
        }
        else if (local_24 == kCfdOutOfRangeError) {
          local_11b = 1;
        }
        else {
          if (local_24 != kCfdConnectionError) {
            local_1c0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                                ,0x2f);
            local_1c0 = local_1c0 + 1;
            local_1b8 = 0xcf;
            local_1b0 = "AddScriptHashSign";
            core::logger::warn<cfd::core::AddressType&>
                      ((CfdSourceLocation *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                       (char *)in_stack_fffffffffffffb88,(AddressType *)0x3a61d4);
            local_1e2 = 1;
            uVar4 = __cxa_allocate_exception(0x30);
            message = &local_1e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1e0,
                       "Invalid address_type. address_type must be \"p2wsh\" or \"p2sh-p2wsh\" or \"p2sh\"."
                       ,message);
            core::CfdException::CfdException
                      ((CfdException *)in_stack_fffffffffffffbb0,local_24,(string *)message);
            local_1e2 = 0;
            __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          local_11b = 1;
          local_11c = 1;
          cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_1a8);
          cfd::core::Script::operator=(&local_158,&local_1a8);
          core::Script::~Script
                    ((Script *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
          CVar5 = local_24;
        }
        if ((local_25 & 1) != 0) {
          if ((local_11b & 1) == 0) {
            SignParameter::SignParameter(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88);
            SignParameter::~SignParameter
                      ((SignParameter *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
          }
          else {
            cfd::core::ByteData::ByteData(local_278);
            SignParameter::SignParameter
                      (in_stack_fffffffffffffbb0,
                       (ByteData *)CONCAT44(CVar5,in_stack_fffffffffffffba8));
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88);
            SignParameter::~SignParameter
                      ((SignParameter *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
            core::ByteData::~ByteData((ByteData *)0x3a632a);
          }
        }
        local_2f8 = local_18;
        local_300._M_current =
             (SignParameter *)
             std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                       ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                        in_stack_fffffffffffffb88);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffb88);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                                  (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                   *)in_stack_fffffffffffffb88), bVar1) {
          __gnu_cxx::
          __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
          ::operator*(&local_300);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          __gnu_cxx::
          __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
          ::operator++(&local_300);
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::empty
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffba0);
        SignParameter::SignParameter
                  (in_stack_fffffffffffffbb0,(Script *)CONCAT44(CVar5,in_stack_fffffffffffffba8));
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                   in_stack_fffffffffffffb88);
        SignParameter::~SignParameter
                  ((SignParameter *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
        if ((local_11b & 1) != 0) {
          AddSign<cfd::ConfidentialTransactionContext>
                    (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f,
                     in_stack_0000003e);
        }
        if ((local_11c & 1) != 0) {
          in_stack_fffffffffffffb97 = cfd::core::Script::IsEmpty();
          if ((in_stack_fffffffffffffb97 & 1) == 0) {
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x3a655e);
            SignParameter::SignParameter
                      (in_stack_fffffffffffffbb0,(Script *)CONCAT44(CVar5,in_stack_fffffffffffffba8)
                      );
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88);
            SignParameter::~SignParameter
                      ((SignParameter *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
            AddSign<cfd::ConfidentialTransactionContext>
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f,
                       in_stack_0000003e);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                       in_stack_fffffffffffffba0);
          }
          else {
            AddSign<cfd::ConfidentialTransactionContext>
                      (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f,
                       in_stack_0000003e);
          }
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffba0);
        core::Script::~Script
                  ((Script *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
        return;
      }
      local_d8 = __gnu_cxx::
                 __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                 ::operator*(&local_c8);
      SVar2 = SignParameter::GetDataType(local_d8);
      if ((SVar2 != kSign) && (SVar2 = SignParameter::GetDataType(local_d8), SVar2 != kBinary))
      break;
      __gnu_cxx::
      __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator++(&local_c8);
    }
    local_f0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                       ,0x2f);
    local_f0 = local_f0 + 1;
    local_e8 = 0xb3;
    local_e0 = "AddScriptHashSign";
    local_f4 = SignParameter::GetDataType(local_d8);
    core::logger::warn<cfd::SignDataType>
              ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (char *)in_stack_fffffffffffffb88,(SignDataType *)0x3a5f8b);
    local_11a = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,"Invalid signature type. signature type must be \"kSign\" or \"kBinary\".",
               &local_119);
    core::CfdException::CfdException(this,in_stack_fffffffffffffbac,in_stack_fffffffffffffba0);
    local_11a = 0;
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_90 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_internal.cpp"
                     ,0x2f);
  local_90 = local_90 + 1;
  local_88 = 0xab;
  local_80 = "AddScriptHashSign";
  core::logger::warn<>
            ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             (char *)in_stack_fffffffffffffb88);
  local_b2 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Invalid outpoint.",&local_b1);
  core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
             in_stack_fffffffffffffba0);
  local_b2 = 0;
  __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddScriptHashSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& signatures, const Script& redeem_script,
    AddressType address_type, bool is_multisig_script) {
  if (redeem_script.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Empty script.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty script.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  for (const auto& signature : signatures) {
    if ((signature.GetDataType() != SignDataType::kSign) &&
        (signature.GetDataType() != SignDataType::kBinary)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid signature type: {}",
          signature.GetDataType());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid signature type. signature type must be \"kSign\" "
          "or \"kBinary\".");  // NOLINT
    }
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wshAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wshAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
      break;
    case AddressType::kP2shAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wsh\" "
          "or \"p2sh-p2wsh\" or \"p2sh\".");  // NOLINT
  }
  if (is_multisig_script) {
    if (has_witness) {
      sign_params.push_back(SignParameter(ByteData()));
    } else {
      sign_params.push_back(SignParameter(ScriptOperator::OP_0));
    }
  }
  for (const auto& signature : signatures) {
    sign_params.push_back(signature);
  }
  bool clear_stack = (sign_params.empty()) ? false : true;
  sign_params.push_back(SignParameter(redeem_script));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, clear_stack);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, clear_stack);
    }
  }
}